

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void kahanBabuskaNeumaierStepInt64(SumCtx *pSum,i64 iVal)

{
  i64 iVar1;
  
  iVar1 = iVal;
  if (iVal + 0xfff0000000000000U < 0xffe0000000000001) {
    iVar1 = iVal % 0x4000;
    kahanBabuskaNeumaierStep(pSum,(double)(iVal - iVar1));
  }
  kahanBabuskaNeumaierStep(pSum,(double)iVar1);
  return;
}

Assistant:

static void kahanBabuskaNeumaierStepInt64(volatile SumCtx *pSum, i64 iVal){
  if( iVal<=-4503599627370496LL || iVal>=+4503599627370496LL ){
    i64 iBig, iSm;
    iSm = iVal % 16384;
    iBig = iVal - iSm;
    kahanBabuskaNeumaierStep(pSum, iBig);
    kahanBabuskaNeumaierStep(pSum, iSm);
  }else{
    kahanBabuskaNeumaierStep(pSum, (double)iVal);
  }
}